

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

LatencyItem * __thiscall MapWrapper::addItem(MapWrapper *this,string *bin_name)

{
  LatencyItem *this_00;
  string asStack_48 [32];
  LatencyItem *local_28;
  
  this_00 = (LatencyItem *)operator_new(0x50);
  LatencyItem::LatencyItem(this_00,bin_name);
  std::__cxx11::string::string(asStack_48,(string *)bin_name);
  local_28 = this_00;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,LatencyItem*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  return this_00;
}

Assistant:

LatencyItem* addItem(const std::string& bin_name) {
        LatencyItem* item = new LatencyItem(bin_name);
        map.insert( std::make_pair(bin_name, item) );
        return item;
    }